

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vbpermq_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  byte bVar1;
  uint64_t perm;
  ulong uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  
  uVar2 = 0;
  for (lVar3 = 0xf; -1 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = b->u8[0];
    if (-1 < (char)bVar1) {
      uVar4 = 0;
      if ((a->u64[bVar1 < 0x40] >> ((ulong)(byte)~bVar1 & 0x3f) & 1) != 0) {
        uVar4 = (ulong)(0x8000 >> ((byte)lVar3 & 0x1f));
      }
      uVar2 = uVar2 | uVar4;
    }
    b = (ppc_avr_t *)(b->u8 + 1);
  }
  r->u64[1] = uVar2;
  r->u64[0] = 0;
  return;
}

Assistant:

void helper_vbpermq(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i;
    uint64_t perm = 0;

    VECTOR_FOR_INORDER_I(i, u8) {
        int index = VBPERMQ_INDEX(b, i);

        if (index < 128) {
            uint64_t mask = (1ull << (63 - (index & 0x3F)));
            if (a->u64[VBPERMQ_DW(index)] & mask) {
                perm |= (0x8000 >> i);
            }
        }
    }

    r->VsrD(0) = perm;
    r->VsrD(1) = 0;
}